

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_dependence.cpp
# Opt level: O2

PartitionedSubscripts * __thiscall
spvtools::opt::LoopDependenceAnalysis::PartitionSubscripts
          (PartitionedSubscripts *__return_storage_ptr__,LoopDependenceAnalysis *this,
          vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
          *source_subscripts,
          vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
          *destination_subscripts)

{
  ScalarEvolutionAnalysis *this_00;
  _Rb_tree_header *p_Var1;
  pointer ppIVar2;
  pointer ppIVar3;
  pointer psVar4;
  _Rb_tree<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::_Identity<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>
  *p_Var5;
  LoopDependenceAnalysis *this_01;
  ulong uVar6;
  _Rb_tree_const_iterator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>
  __last;
  SENode *pSVar7;
  _Rb_tree_const_iterator<const_spvtools::opt::Loop_*> _Var8;
  _Base_ptr p_Var9;
  ulong uVar10;
  pointer ppLVar11;
  long lVar12;
  const_iterator __first;
  _Rb_tree<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::_Identity<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>
  *p_Var13;
  size_t i;
  long lVar14;
  _Rb_tree<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::_Identity<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>
  *p_Var15;
  ulong uVar16;
  const_iterator __last_00;
  initializer_list<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_> __l;
  Loop *local_c0;
  LoopDependenceAnalysis *local_b8;
  pointer local_b0;
  pointer local_a8;
  Loop *local_a0;
  _Rb_tree<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::_Identity<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>
  *local_98;
  vector<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
  source_recurrences;
  vector<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
  destination_recurrences;
  set<const_spvtools::opt::Loop_*,_std::less<const_spvtools::opt::Loop_*>,_std::allocator<const_spvtools::opt::Loop_*>_>
  loops_in_pair;
  
  (__return_storage_ptr__->
  super__Vector_base<std::set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>,_std::allocator<std::set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>,_std::allocator<std::set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>,_std::allocator<std::set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  ppIVar2 = (source_subscripts->
            super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  ppIVar3 = (source_subscripts->
            super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  for (lVar14 = 0; (long)ppIVar2 - (long)ppIVar3 >> 3 != lVar14; lVar14 = lVar14 + 1) {
    source_recurrences.
    super__Vector_base<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)(source_subscripts->
                  super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                  )._M_impl.super__Vector_impl_data._M_start[lVar14];
    source_recurrences.
    super__Vector_base<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (pointer)(destination_subscripts->
                  super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                  )._M_impl.super__Vector_impl_data._M_start[lVar14];
    __l._M_len = 1;
    __l._M_array = (iterator)&source_recurrences;
    std::
    set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>
    ::set((set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>
           *)&loops_in_pair,__l,
          (less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_> *)
          &destination_recurrences,(allocator_type *)&local_c0);
    std::
    vector<std::set<std::pair<spvtools::opt::Instruction*,spvtools::opt::Instruction*>,std::less<std::pair<spvtools::opt::Instruction*,spvtools::opt::Instruction*>>,std::allocator<std::pair<spvtools::opt::Instruction*,spvtools::opt::Instruction*>>>,std::allocator<std::set<std::pair<spvtools::opt::Instruction*,spvtools::opt::Instruction*>,std::less<std::pair<spvtools::opt::Instruction*,spvtools::opt::Instruction*>>,std::allocator<std::pair<spvtools::opt::Instruction*,spvtools::opt::Instruction*>>>>>
    ::
    emplace_back<std::set<std::pair<spvtools::opt::Instruction*,spvtools::opt::Instruction*>,std::less<std::pair<spvtools::opt::Instruction*,spvtools::opt::Instruction*>>,std::allocator<std::pair<spvtools::opt::Instruction*,spvtools::opt::Instruction*>>>>
              ((vector<std::set<std::pair<spvtools::opt::Instruction*,spvtools::opt::Instruction*>,std::less<std::pair<spvtools::opt::Instruction*,spvtools::opt::Instruction*>>,std::allocator<std::pair<spvtools::opt::Instruction*,spvtools::opt::Instruction*>>>,std::allocator<std::set<std::pair<spvtools::opt::Instruction*,spvtools::opt::Instruction*>,std::less<std::pair<spvtools::opt::Instruction*,spvtools::opt::Instruction*>>,std::allocator<std::pair<spvtools::opt::Instruction*,spvtools::opt::Instruction*>>>>>
                *)__return_storage_ptr__,
               (set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>
                *)&loops_in_pair);
    std::
    _Rb_tree<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::_Identity<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>
    ::~_Rb_tree((_Rb_tree<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::_Identity<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>
                 *)&loops_in_pair);
  }
  local_b0 = (this->loops_).
             super__Vector_base<const_spvtools::opt::Loop_*,_std::allocator<const_spvtools::opt::Loop_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  ppLVar11 = (this->loops_).
             super__Vector_base<const_spvtools::opt::Loop_*,_std::allocator<const_spvtools::opt::Loop_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  while (ppLVar11 != local_b0) {
    local_a0 = *ppLVar11;
    uVar6 = 0xffffffffffffffff;
    local_a8 = ppLVar11;
    for (uVar16 = 0;
        psVar4 = (__return_storage_ptr__->
                 super__Vector_base<std::set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>,_std::allocator<std::set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start,
        uVar16 < (ulong)(((long)(__return_storage_ptr__->
                                super__Vector_base<std::set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>,_std::allocator<std::set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_finish - (long)psVar4) / 0x30);
        uVar16 = uVar16 + 1) {
      local_98 = &psVar4[uVar16]._M_t;
      __last._M_node = &psVar4[uVar16]._M_t._M_impl.super__Rb_tree_header._M_header;
      p_Var9 = *(_Base_ptr *)((long)&psVar4[uVar16]._M_t._M_impl.super__Rb_tree_header + 0x10);
      local_c0 = local_a0;
      local_b8 = this;
      for (; this_01 = local_b8, uVar10 = uVar6, p_Var9 != __last._M_node;
          p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9)) {
        this_00 = &local_b8->scalar_evolution_;
        pSVar7 = ScalarEvolutionAnalysis::AnalyzeInstruction(this_00,*(Instruction **)(p_Var9 + 1));
        SENode::CollectRecurrentNodes(&source_recurrences,pSVar7);
        pSVar7 = ScalarEvolutionAnalysis::AnalyzeInstruction
                           (this_00,(Instruction *)p_Var9[1]._M_parent);
        SENode::CollectRecurrentNodes
                  ((vector<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
                    *)&destination_recurrences.
                       super__Vector_base<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
                   ,pSVar7);
        std::vector<spvtools::opt::SERecurrentNode*,std::allocator<spvtools::opt::SERecurrentNode*>>
        ::
        insert<__gnu_cxx::__normal_iterator<spvtools::opt::SERecurrentNode**,std::vector<spvtools::opt::SERecurrentNode*,std::allocator<spvtools::opt::SERecurrentNode*>>>,void>
                  ((vector<spvtools::opt::SERecurrentNode*,std::allocator<spvtools::opt::SERecurrentNode*>>
                    *)&source_recurrences,
                   (const_iterator)
                   source_recurrences.
                   super__Vector_base<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish,
                   (__normal_iterator<spvtools::opt::SERecurrentNode_**,_std::vector<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>_>
                    )destination_recurrences.
                     super__Vector_base<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                   (__normal_iterator<spvtools::opt::SERecurrentNode_**,_std::vector<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>_>
                    )destination_recurrences.
                     super__Vector_base<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
        CollectLoops((set<const_spvtools::opt::Loop_*,_std::less<const_spvtools::opt::Loop_*>,_std::allocator<const_spvtools::opt::Loop_*>_>
                      *)&loops_in_pair._M_t,this_01,&source_recurrences);
        p_Var1 = &loops_in_pair._M_t._M_impl.super__Rb_tree_header;
        _Var8 = std::
                __find_if<std::_Rb_tree_const_iterator<spvtools::opt::Loop_const*>,__gnu_cxx::__ops::_Iter_equals_val<spvtools::opt::Loop_const*const>>
                          (loops_in_pair._M_t._M_impl.super__Rb_tree_header._M_header._M_left,p_Var1
                           ,&local_c0);
        std::
        _Rb_tree<const_spvtools::opt::Loop_*,_const_spvtools::opt::Loop_*,_std::_Identity<const_spvtools::opt::Loop_*>,_std::less<const_spvtools::opt::Loop_*>,_std::allocator<const_spvtools::opt::Loop_*>_>
        ::~_Rb_tree(&loops_in_pair._M_t);
        std::
        _Vector_base<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
        ::~_Vector_base(&destination_recurrences.
                         super__Vector_base<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
                       );
        std::
        _Vector_base<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
        ::~_Vector_base((_Vector_base<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
                         *)&source_recurrences);
        p_Var15 = local_98;
        if ((_Rb_tree_header *)_Var8._M_node != p_Var1) {
          if ((p_Var9 != __last._M_node) && (uVar10 = uVar16, uVar6 != 0xffffffffffffffff)) {
            std::
            _Rb_tree<std::pair<spvtools::opt::Instruction*,spvtools::opt::Instruction*>,std::pair<spvtools::opt::Instruction*,spvtools::opt::Instruction*>,std::_Identity<std::pair<spvtools::opt::Instruction*,spvtools::opt::Instruction*>>,std::less<std::pair<spvtools::opt::Instruction*,spvtools::opt::Instruction*>>,std::allocator<std::pair<spvtools::opt::Instruction*,spvtools::opt::Instruction*>>>
            ::
            _M_insert_range_unique<std::_Rb_tree_const_iterator<std::pair<spvtools::opt::Instruction*,spvtools::opt::Instruction*>>>
                      ((_Rb_tree<std::pair<spvtools::opt::Instruction*,spvtools::opt::Instruction*>,std::pair<spvtools::opt::Instruction*,spvtools::opt::Instruction*>,std::_Identity<std::pair<spvtools::opt::Instruction*,spvtools::opt::Instruction*>>,std::less<std::pair<spvtools::opt::Instruction*,spvtools::opt::Instruction*>>,std::allocator<std::pair<spvtools::opt::Instruction*,spvtools::opt::Instruction*>>>
                        *)((__return_storage_ptr__->
                           super__Vector_base<std::set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>,_std::allocator<std::set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start + uVar6),
                       (local_98->_M_impl).super__Rb_tree_header._M_header._M_left,__last);
            std::
            _Rb_tree<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::_Identity<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>
            ::clear(p_Var15);
            uVar10 = uVar6;
          }
          break;
        }
      }
      uVar6 = uVar10;
    }
    ppLVar11 = local_a8 + 1;
  }
  psVar4 = (__return_storage_ptr__->
           super__Vector_base<std::set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>,_std::allocator<std::set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  __last_00._M_current =
       (__return_storage_ptr__->
       super__Vector_base<std::set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>,_std::allocator<std::set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>_>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  lVar12 = (long)__last_00._M_current - (long)psVar4;
  p_Var15 = &psVar4[2]._M_t;
  for (lVar14 = lVar12 / 0x30 >> 2; 0 < lVar14; lVar14 = lVar14 + -1) {
    if (p_Var15[-2]._M_impl.super__Rb_tree_header._M_node_count == 0) {
      __first._M_current =
           (set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>
            *)(p_Var15 + -2);
      goto LAB_005000a3;
    }
    if (p_Var15[-1]._M_impl.super__Rb_tree_header._M_node_count == 0) {
      __first._M_current =
           (set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>
            *)(p_Var15 + -1);
      goto LAB_005000a3;
    }
    __first._M_current =
         (set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>
          *)p_Var15;
    if ((p_Var15->_M_impl).super__Rb_tree_header._M_node_count == 0) goto LAB_005000a3;
    if (p_Var15[1]._M_impl.super__Rb_tree_header._M_node_count == 0) {
      __first._M_current =
           (set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>
            *)(p_Var15 + 1);
      goto LAB_005000a3;
    }
    p_Var15 = p_Var15 + 4;
    lVar12 = lVar12 + -0xc0;
  }
  lVar12 = lVar12 / 0x30;
  p_Var13 = p_Var15 + -2;
  if (lVar12 == 1) {
LAB_00500127:
    __first._M_current =
         (set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>
          *)p_Var13;
    if ((p_Var13->_M_impl).super__Rb_tree_header._M_node_count != 0) {
      __first._M_current = __last_00._M_current;
    }
  }
  else if (lVar12 == 3) {
    __first._M_current =
         (set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>
          *)p_Var13;
    if (p_Var15[-2]._M_impl.super__Rb_tree_header._M_node_count != 0) {
      p_Var13 = p_Var15 + -1;
      goto LAB_0050011c;
    }
  }
  else {
    __first._M_current = __last_00._M_current;
    if (lVar12 != 2) goto LAB_005000eb;
LAB_0050011c:
    __first._M_current =
         (set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>
          *)p_Var13;
    if ((p_Var13->_M_impl).super__Rb_tree_header._M_node_count != 0) {
      p_Var13 = p_Var13 + 1;
      goto LAB_00500127;
    }
  }
LAB_005000a3:
  p_Var15 = &(__first._M_current)->_M_t;
  if (__first._M_current != __last_00._M_current) {
    while (p_Var13 = &(__first._M_current)->_M_t + 1, p_Var13 != &(__last_00._M_current)->_M_t) {
      p_Var5 = &(__first._M_current)->_M_t + 1;
      __first._M_current =
           (set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>
            *)p_Var13;
      if ((p_Var5->_M_impl).super__Rb_tree_header._M_node_count != 0) {
        std::
        _Rb_tree<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::_Identity<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>
        ::_M_move_assign(p_Var15,p_Var13);
        p_Var15 = p_Var15 + 1;
      }
    }
    __last_00._M_current =
         (__return_storage_ptr__->
         super__Vector_base<std::set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>,_std::allocator<std::set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>_>_>
         )._M_impl.super__Vector_impl_data._M_finish;
    __first._M_current =
         (set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>
          *)p_Var15;
  }
LAB_005000eb:
  std::
  vector<std::set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>,_std::allocator<std::set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>_>_>
  ::erase(__return_storage_ptr__,__first,__last_00);
  return __return_storage_ptr__;
}

Assistant:

PartitionedSubscripts LoopDependenceAnalysis::PartitionSubscripts(
    const std::vector<Instruction*>& source_subscripts,
    const std::vector<Instruction*>& destination_subscripts) {
  PartitionedSubscripts partitions{};

  auto num_subscripts = source_subscripts.size();

  // Create initial partitions with one subscript pair per partition.
  for (size_t i = 0; i < num_subscripts; ++i) {
    partitions.push_back({{source_subscripts[i], destination_subscripts[i]}});
  }

  // Iterate over the loops to create all partitions
  for (auto loop : loops_) {
    int64_t k = -1;

    for (size_t j = 0; j < partitions.size(); ++j) {
      auto& current_partition = partitions[j];

      // Does |loop| appear in |current_partition|
      auto it = std::find_if(
          current_partition.begin(), current_partition.end(),
          [loop,
           this](const std::pair<Instruction*, Instruction*>& elem) -> bool {
            auto source_recurrences =
                scalar_evolution_.AnalyzeInstruction(std::get<0>(elem))
                    ->CollectRecurrentNodes();
            auto destination_recurrences =
                scalar_evolution_.AnalyzeInstruction(std::get<1>(elem))
                    ->CollectRecurrentNodes();

            source_recurrences.insert(source_recurrences.end(),
                                      destination_recurrences.begin(),
                                      destination_recurrences.end());

            auto loops_in_pair = CollectLoops(source_recurrences);
            auto end_it = loops_in_pair.end();

            return std::find(loops_in_pair.begin(), end_it, loop) != end_it;
          });

      auto has_loop = it != current_partition.end();

      if (has_loop) {
        if (k == -1) {
          k = j;
        } else {
          // Add |partitions[j]| to |partitions[k]| and discard |partitions[j]|
          partitions[static_cast<size_t>(k)].insert(current_partition.begin(),
                                                    current_partition.end());
          current_partition.clear();
        }
      }
    }
  }

  // Remove empty (discarded) partitions
  partitions.erase(
      std::remove_if(
          partitions.begin(), partitions.end(),
          [](const std::set<std::pair<Instruction*, Instruction*>>& partition) {
            return partition.empty();
          }),
      partitions.end());

  return partitions;
}